

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

precise_unit __thiscall units::precise_unit::operator*(precise_unit *this,precise_unit *other)

{
  precise_unit *in_RSI;
  precise_unit *in_RDI;
  double dVar1;
  double dVar2;
  unit_data *unaff_retaddr;
  unit_data *in_stack_00000008;
  uint local_48;
  uint local_44;
  unit_data local_24;
  precise_unit *local_20;
  precise_unit local_10;
  
  local_20 = in_RSI;
  dVar1 = multiplier(in_RDI);
  dVar2 = multiplier(local_20);
  local_24 = units::detail::unit_data::operator*(in_stack_00000008,unaff_retaddr);
  if (in_RDI->commodity_ == 0) {
    local_44 = local_20->commodity_;
  }
  else {
    if (local_20->commodity_ == 0) {
      local_48 = in_RDI->commodity_;
    }
    else {
      local_48 = in_RDI->commodity_ | local_20->commodity_;
    }
    local_44 = local_48;
  }
  precise_unit(&local_10,dVar1 * dVar2,&local_24,local_44);
  return local_10;
}

Assistant:

constexpr precise_unit operator*(const precise_unit& other) const
    {
        return {
            multiplier() * other.multiplier(),
            base_units_ * other.base_units_,
            (commodity_ == 0) ?
                other.commodity_ :
                ((other.commodity_ == 0) ? commodity_ :
                                           commodity_ | other.commodity_),
        };
    }